

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O1

int quick_select_int(int *arr,int n)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int t_1;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int t_3;
  int t_2;
  
  uVar5 = n - 1;
  iVar4 = (n - ((int)uVar5 >> 0x1f)) + -1 >> 1;
  if (1 < n) {
    iVar6 = 0;
    do {
      uVar11 = iVar6 + 1;
      uVar8 = (ulong)uVar11;
      if (uVar5 == uVar11) {
        iVar1 = arr[iVar6];
        if (arr[(int)uVar5] < iVar1) {
          arr[iVar6] = arr[(int)uVar5];
          arr[(int)uVar5] = iVar1;
        }
        break;
      }
      iVar9 = (int)(iVar6 + uVar5) / 2;
      iVar1 = arr[iVar9];
      if (arr[(int)uVar5] < iVar1) {
        arr[iVar9] = arr[(int)uVar5];
        arr[(int)uVar5] = iVar1;
      }
      iVar1 = arr[iVar6];
      if (arr[(int)uVar5] < iVar1) {
        arr[iVar6] = arr[(int)uVar5];
        arr[(int)uVar5] = iVar1;
      }
      iVar1 = arr[iVar9];
      if (arr[iVar6] < iVar1) {
        arr[iVar9] = arr[iVar6];
        arr[iVar6] = iVar1;
      }
      iVar1 = arr[iVar9];
      arr[iVar9] = arr[(int)uVar11];
      arr[(int)uVar11] = iVar1;
      uVar11 = uVar5;
      while( true ) {
        iVar1 = arr[iVar6];
        uVar8 = (ulong)(int)uVar8;
        do {
          iVar9 = arr[uVar8 + 1];
          uVar8 = uVar8 + 1;
        } while (iVar9 < iVar1);
        lVar3 = (long)(int)uVar11 + 1;
        do {
          uVar10 = uVar11;
          lVar7 = lVar3;
          iVar2 = arr[lVar7 + -2];
          uVar11 = uVar10 - 1;
          lVar3 = lVar7 + -1;
        } while (iVar1 < iVar2);
        if (lVar7 + -1 <= (long)uVar8) break;
        arr[uVar8] = iVar2;
        arr[lVar7 + -2] = iVar9;
      }
      arr[iVar6] = iVar2;
      arr[lVar7 + -2] = iVar1;
      if ((int)uVar11 <= iVar4) {
        iVar6 = (int)uVar8;
      }
      if (iVar4 < (int)uVar10) {
        uVar5 = uVar10 - 2;
      }
    } while (iVar6 < (int)uVar5);
  }
  return arr[iVar4];
}

Assistant:

static int quick_select_int(int arr[], int n) 
{
    int low, high ;
    int median;
    int middle, ll, hh;

    low = 0 ; high = n-1 ; median = (low + high) / 2;
    for (;;) {
        if (high <= low) /* One element only */
            return arr[median] ;

        if (high == low + 1) {  /* Two elements only */
            if (arr[low] > arr[high])
                ELEM_SWAP(arr[low], arr[high]) ;
            return arr[median] ;
        }

    /* Find median of low, middle and high items; swap into position low */
    middle = (low + high) / 2;
    if (arr[middle] > arr[high])    ELEM_SWAP(arr[middle], arr[high]) ;
    if (arr[low] > arr[high])       ELEM_SWAP(arr[low], arr[high]) ;
    if (arr[middle] > arr[low])     ELEM_SWAP(arr[middle], arr[low]) ;

    /* Swap low item (now in position middle) into position (low+1) */
    ELEM_SWAP(arr[middle], arr[low+1]) ;

    /* Nibble from each end towards middle, swapping items when stuck */
    ll = low + 1;
    hh = high;
    for (;;) {
        do ll++; while (arr[low] > arr[ll]) ;
        do hh--; while (arr[hh]  > arr[low]) ;

        if (hh < ll)
        break;

        ELEM_SWAP(arr[ll], arr[hh]) ;
    }

    /* Swap middle item (in position low) back into correct position */
    ELEM_SWAP(arr[low], arr[hh]) ;

    /* Re-set active partition */
    if (hh <= median)
        low = ll;
        if (hh >= median)
        high = hh - 1;
    }
}